

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall ACSStringPool::InsertString(ACSStringPool *this,FString *str,uint h,uint bucketnum)

{
  uint uVar1;
  PoolEntry *this_00;
  PoolEntry *entry;
  uint index;
  uint bucketnum_local;
  uint h_local;
  FString *str_local;
  ACSStringPool *this_local;
  
  entry._4_4_ = this->FirstFreeEntry;
  if (99 < entry._4_4_) {
    uVar1 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Max(&this->Pool);
    if (entry._4_4_ == uVar1) {
      P_CollectACSGlobalStrings();
      entry._4_4_ = this->FirstFreeEntry;
    }
  }
  if (this->FirstFreeEntry < 0x7ff00000) {
    uVar1 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Size(&this->Pool);
    if (entry._4_4_ == uVar1) {
      TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::Reserve(&this->Pool,1);
      this->FirstFreeEntry = this->FirstFreeEntry + 1;
    }
    else {
      FindFirstFreeEntry(this,this->FirstFreeEntry + 1);
    }
    this_00 = TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::operator[]
                        (&this->Pool,(ulong)entry._4_4_);
    FString::operator=(&this_00->Str,str);
    this_00->Hash = h;
    this_00->Next = this->PoolBuckets[bucketnum];
    this_00->LockCount = 0;
    this->PoolBuckets[bucketnum] = entry._4_4_;
    this_local._4_4_ = entry._4_4_ | 0x7ff00000;
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int ACSStringPool::InsertString(FString &str, unsigned int h, unsigned int bucketnum)
{
	unsigned int index = FirstFreeEntry;
	if (index >= MIN_GC_SIZE && index == Pool.Max())
	{ // We will need to grow the array. Try a garbage collection first.
		P_CollectACSGlobalStrings();
		index = FirstFreeEntry;
	}
	if (FirstFreeEntry >= STRPOOL_LIBRARYID_OR)
	{ // If we go any higher, we'll collide with the library ID marker.
		return -1;
	}
	if (index == Pool.Size())
	{ // There were no free entries; make a new one.
		Pool.Reserve(1);
		FirstFreeEntry++;
	}
	else
	{ // Scan for the next free entry
		FindFirstFreeEntry(FirstFreeEntry + 1);
	}
	PoolEntry *entry = &Pool[index];
	entry->Str = str;
	entry->Hash = h;
	entry->Next = PoolBuckets[bucketnum];
	entry->LockCount = 0;
	PoolBuckets[bucketnum] = index;
	return index | STRPOOL_LIBRARYID_OR;
}